

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanCastTests.cpp
# Opt level: O1

int testSpanCastTestsBasics(void)

{
  ostream *poVar1;
  int iVar2;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> values;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> local_30;
  int local_18 [4];
  
  local_18[0] = 1;
  local_18[1] = 2;
  local_18[2] = 3;
  local_18[3] = 4;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::vector<int,_std::allocator<int>_>::vector(&local_30,__l,&local_31);
  if (((long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start & 0xfffffffffffffff8U) == 0x10) {
    iVar2 = 0;
    if ((long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != 0x10) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanCastTests.cpp"
                 ,0x75);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"(span.Size()) == (original.Size())",0x22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      iVar2 = 1;
      std::ostream::flush();
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanCastTests.cpp"
               ,0x75);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(casted.Size()) == (size_t(2))",0x1e)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    iVar2 = 1;
    std::ostream::flush();
  }
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar2;
}

Assistant:

int testSpanCastTestsBasics()
{
    const std::vector<int32_t> values = {1, 2, 3, 4};
    Span<const int32_t> span = MakeSpan(values);

    {  // up cast
        Span<const int64_t> casted = SpanCast<const int64_t>(span);
        ML_ASSERT_EQ(casted.Size(), size_t(2));

        Span<const int32_t> original = SpanCast<const int32_t>(casted);
        ML_ASSERT_EQ(span.Data(), original.Data());
        ML_ASSERT_EQ(span.Size(), original.Size());
    }

    {  // down cast
        Span<const int8_t> casted = SpanCast<const int8_t>(span);
        ML_ASSERT_EQ(casted.Size(), size_t(16));

        Span<const int32_t> original = SpanCast<const int32_t>(casted);
        ML_ASSERT_EQ(span.Data(), original.Data());
        ML_ASSERT_EQ(span.Size(), original.Size());
    }

    return 0;
}